

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _back;
  undefined4 uVar1;
  DepthBiasBaseCase *this_01;
  mapped_type *ppcVar2;
  long lVar3;
  DepthStencilState *pDVar4;
  DepthStencilState *pDVar5;
  byte bVar6;
  RGBA local_fc;
  StencilOpState local_f8;
  VkStencilOpState local_d0;
  DepthStencilState local_b0;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  
  bVar6 = 0;
  this_01 = (DepthBiasBaseCase *)operator_new(0x248);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_48,&(this->m_shaderPaths)._M_t);
  local_b0.super_VkPipelineDepthStencilStateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&local_b0);
  vertexShaderName = *ppcVar2;
  local_f8.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&local_f8);
  DynamicState::anon_unknown_0::DepthBiasBaseCase::DepthBiasBaseCase
            (this_01,context,vertexShaderName,*ppcVar2);
  (this_01->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DepthBiasBaseCase_00c037a8;
  local_f8.super_VkStencilOpState.failOp = 0xbf800000;
  local_f8.super_VkStencilOpState.passOp = 0x3f800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  this_00 = &this_01->m_data;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState._0_8_ = &DAT_3f8000003f800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0xbf800000;
  local_f8.super_VkStencilOpState.passOp = 0xbf800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0x3f800000;
  local_f8.super_VkStencilOpState.passOp = 0xbf800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0xbf000000;
  local_f8.super_VkStencilOpState.passOp = 0x3f000000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f800000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0x3f000000;
  local_f8.super_VkStencilOpState.passOp = 0x3f000000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f800000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0xbf000000;
  local_f8.super_VkStencilOpState.passOp = 0xbf000000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f800000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0x3f000000;
  local_f8.super_VkStencilOpState.passOp = 0xbf000000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f800000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0xbf800000;
  local_f8.super_VkStencilOpState.passOp = 0x3f800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff0000ff;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState._0_8_ = &DAT_3f8000003f800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff0000ff;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0xbf800000;
  local_f8.super_VkStencilOpState.passOp = 0xbf800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff0000ff;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  local_f8.super_VkStencilOpState.failOp = 0x3f800000;
  local_f8.super_VkStencilOpState.passOp = 0xbf800000;
  local_f8.super_VkStencilOpState.depthFailOp = 0x3f000000;
  local_f8.super_VkStencilOpState.compareOp = 0x3f800000;
  local_fc.m_value = 0xff0000ff;
  tcu::RGBA::toVec(&local_fc);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_b0,(Vec4 *)&local_f8,(Vec4 *)&local_d0);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_b0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&local_f8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_d0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_f8.super_VkStencilOpState.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_f8.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.passOp = local_f8.super_VkStencilOpState.passOp;
  _front.super_VkStencilOpState.compareOp = local_f8.super_VkStencilOpState.compareOp;
  _front.super_VkStencilOpState.compareMask = local_f8.super_VkStencilOpState.compareMask;
  _front.super_VkStencilOpState.writeMask = local_f8.super_VkStencilOpState.writeMask;
  _front.super_VkStencilOpState.reference = local_f8.super_VkStencilOpState.reference;
  _back.super_VkStencilOpState.depthFailOp = local_d0.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_d0.failOp;
  _back.super_VkStencilOpState.passOp = local_d0.passOp;
  _back.super_VkStencilOpState.compareOp = local_d0.compareOp;
  _back.super_VkStencilOpState.compareMask = local_d0.compareMask;
  _back.super_VkStencilOpState.writeMask = local_d0.writeMask;
  _back.super_VkStencilOpState.reference = local_d0.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            (&local_b0,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,0,0,_front,_back,0.0,1.0);
  pDVar4 = &local_b0;
  pDVar5 = &this_01->m_depthStencilState;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(pDVar4->super_VkPipelineDepthStencilStateCreateInfo).field_0x4;
    (pDVar5->super_VkPipelineDepthStencilStateCreateInfo).sType =
         (pDVar4->super_VkPipelineDepthStencilStateCreateInfo).sType;
    *(undefined4 *)&(pDVar5->super_VkPipelineDepthStencilStateCreateInfo).field_0x4 = uVar1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pDVar5 = (DepthStencilState *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  DynamicState::anon_unknown_0::DepthBiasBaseCase::initialize(this_01);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_48);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}